

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O1

void __thiscall
basisu::vector<basisu::vector<basisu::gpu_image>_>::~vector
          (vector<basisu::vector<basisu::gpu_image>_> *this)

{
  uint uVar1;
  gpu_image *pgVar2;
  void *__ptr;
  long lVar3;
  vector<basisu::gpu_image> *pvVar4;
  vector<basisu::gpu_image> *pvVar5;
  
  pvVar4 = this->m_p;
  if (pvVar4 != (vector<basisu::gpu_image> *)0x0) {
    if ((ulong)this->m_size != 0) {
      pvVar5 = pvVar4 + this->m_size;
      do {
        pgVar2 = pvVar4->m_p;
        if (pgVar2 != (gpu_image *)0x0) {
          uVar1 = pvVar4->m_size;
          if ((ulong)uVar1 != 0) {
            lVar3 = 0;
            do {
              __ptr = *(void **)((long)&(pgVar2->m_blocks).m_p + lVar3);
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
              lVar3 = lVar3 + 0x30;
            } while ((ulong)uVar1 * 0x30 != lVar3);
          }
          free(pvVar4->m_p);
        }
        pvVar4 = pvVar4 + 1;
      } while (pvVar4 != pvVar5);
    }
    free(this->m_p);
    return;
  }
  return;
}

Assistant:

inline ~vector()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
         }
      }